

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

bool __thiscall
Assimp::MD5Importer::CanRead(MD5Importer *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string extension;
  char *tokens [1];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"md5anim");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"md5mesh");
    if (!bVar1) {
      bVar1 = std::operator==(&extension,"md5camera");
      if (!bVar1) {
        if (extension._M_string_length == 0 || checkSig) {
          if (pIOHandler != (IOSystem *)0x0) {
            tokens[0] = "MD5Version";
            bVar2 = BaseImporter::SearchFileHeaderForToken
                              (pIOHandler,pFile,tokens,1,200,false,false);
          }
        }
        else {
          bVar2 = false;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool MD5Importer::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "md5anim" || extension == "md5mesh" || extension == "md5camera")
        return true;
    else if (!extension.length() || checkSig)   {
        if (!pIOHandler) {
            return true;
        }
        const char* tokens[] = {"MD5Version"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}